

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O0

int __thiscall ncnn::LSTM_x86_avx::create_pipeline(LSTM_x86_avx *this,Option *opt)

{
  int *piVar1;
  long *plVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  byte *in_RSI;
  long *in_RDI;
  int i_3;
  int i_2;
  float *weight_hc_IFOG_1;
  float *weight_xc_IFOG_1;
  float *weight_hc_G_2;
  float *weight_hc_O_2;
  float *weight_hc_F_2;
  float *weight_hc_I_2;
  float *weight_xc_G_2;
  float *weight_xc_O_2;
  float *weight_xc_F_2;
  float *weight_xc_I_2;
  int i_1;
  int i;
  float *weight_hc_IFOG;
  float *weight_xc_IFOG;
  float *weight_hc_G_1;
  float *weight_hc_O_1;
  float *weight_hc_F_1;
  float *weight_hc_I_1;
  float *weight_hc_G;
  float *weight_hc_O;
  float *weight_hc_F;
  float *weight_hc_I;
  float *weight_xc_G_1;
  float *weight_xc_O_1;
  float *weight_xc_F_1;
  float *weight_xc_I_1;
  float *weight_xc_G;
  float *weight_xc_O;
  float *weight_xc_F;
  float *weight_xc_I;
  int q;
  float *bias_c_IFOG;
  float *bias_c_G;
  float *bias_c_O;
  float *bias_c_F;
  float *bias_c_I;
  Mat weight_hc_data_packed_dr;
  Mat bias_c_data_packed_dr;
  Mat weight_xc_data_packed_dr;
  Mat weight_hc;
  Mat bias_c;
  Mat weight_xc;
  int dr;
  int size;
  int num_directions;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  undefined8 in_stack_fffffffffffff430;
  int _elempack;
  size_t in_stack_fffffffffffff438;
  undefined8 in_stack_fffffffffffff440;
  int _c;
  undefined8 in_stack_fffffffffffff448;
  Mat *in_stack_fffffffffffff450;
  Allocator *in_stack_fffffffffffff4b0;
  int local_9d8;
  int local_9d4;
  undefined4 *local_9d0;
  undefined4 *local_9c8;
  int local_980;
  int local_97c;
  undefined4 *local_978;
  undefined4 *local_970;
  int local_8e4;
  undefined4 *local_8e0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined4 local_8a0;
  long local_898;
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_880;
  undefined8 local_878;
  undefined8 local_870;
  undefined8 local_868;
  undefined8 local_860;
  undefined4 local_858;
  long local_850;
  undefined4 local_848;
  undefined4 local_844;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined8 local_830;
  undefined8 local_828;
  undefined8 local_820;
  undefined8 local_818;
  undefined4 local_810;
  long local_808;
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined8 local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined8 local_7d0;
  undefined4 local_7c8;
  undefined8 local_7c0;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined8 local_7a0;
  undefined8 local_788;
  undefined8 local_780;
  undefined8 local_778;
  undefined4 local_770;
  undefined8 local_768;
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  undefined4 local_754;
  undefined4 local_750;
  undefined8 local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined8 local_730;
  undefined4 local_728;
  undefined8 local_720;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  undefined8 local_700;
  int local_6f4;
  int local_6f0;
  int local_6ec;
  byte *local_6e8;
  undefined8 *local_6d8;
  undefined8 *local_6c8;
  undefined8 *local_6b8;
  undefined8 *local_6a8;
  undefined8 *local_698;
  undefined8 *local_688;
  undefined1 local_675;
  int local_674;
  long *local_670;
  undefined8 *local_668;
  undefined1 local_655;
  int local_654;
  long *local_650;
  undefined8 *local_648;
  undefined1 local_635;
  int local_634;
  long *local_630;
  undefined8 *local_628;
  undefined1 local_615;
  int local_614;
  long *local_610;
  undefined8 *local_608;
  undefined1 local_5f5;
  int local_5f4;
  long *local_5f0;
  undefined8 *local_5e8;
  undefined1 local_5d5;
  int local_5d4;
  long *local_5d0;
  undefined8 *local_5c8;
  int local_5b4;
  undefined8 *local_5b0;
  int local_5a4;
  undefined8 *local_5a0;
  int local_594;
  undefined8 *local_590;
  int local_584;
  undefined8 *local_580;
  int local_574;
  undefined8 *local_570;
  int local_564;
  undefined8 *local_560;
  int local_554;
  undefined8 *local_550;
  int local_544;
  undefined8 *local_540;
  int local_534;
  undefined8 *local_530;
  int local_524;
  undefined8 *local_520;
  int local_514;
  undefined8 *local_510;
  int local_504;
  undefined8 *local_500;
  int local_4f4;
  undefined8 *local_4f0;
  int local_4e4;
  undefined8 *local_4e0;
  int local_4d4;
  undefined8 *local_4d0;
  int local_4c4;
  undefined8 *local_4c0;
  int local_4b4;
  undefined8 *local_4b0;
  int local_4a4;
  undefined8 *local_4a0;
  int local_494;
  undefined8 *local_490;
  int local_484;
  undefined8 *local_480;
  int local_474;
  undefined8 *local_470;
  int local_464;
  undefined8 *local_460;
  int local_454;
  undefined8 *local_450;
  int local_444;
  undefined8 *local_440;
  undefined4 local_434;
  undefined8 *local_430;
  undefined4 local_424;
  undefined8 *local_420;
  undefined4 local_414;
  undefined8 *local_410;
  undefined4 local_404;
  undefined8 *local_400;
  int local_3f4;
  undefined8 *local_3f0;
  int local_3e4;
  undefined8 *local_3e0;
  int local_3d4;
  undefined8 *local_3d0;
  int local_3c4;
  undefined8 *local_3c0;
  undefined4 local_3b4;
  undefined8 *local_3b0;
  undefined8 *local_330;
  undefined8 *local_310;
  undefined8 *local_2f0;
  undefined8 *local_2d0;
  undefined8 *local_2b0;
  undefined8 *local_290;
  int local_288;
  undefined4 local_284;
  undefined8 *local_280;
  int local_278;
  undefined4 local_274;
  undefined8 *local_270;
  int local_268;
  undefined4 local_264;
  undefined8 *local_260;
  undefined8 local_258;
  undefined4 local_24c;
  long local_248;
  long local_240;
  undefined4 local_234;
  int local_230;
  int local_22c;
  undefined8 *local_228;
  undefined8 local_220;
  undefined4 local_214;
  long local_210;
  long local_208;
  undefined4 local_1fc;
  int local_1f8;
  int local_1f4;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  long local_1d0;
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  undefined8 *local_1b8;
  long local_1b0;
  undefined4 local_1a4;
  long local_1a0;
  long local_198;
  undefined4 local_18c;
  int local_188;
  int local_184;
  undefined8 *local_180;
  long local_178;
  undefined4 local_16c;
  long local_168;
  undefined4 *local_160;
  undefined4 local_154;
  int local_150;
  int local_14c;
  undefined8 *local_148;
  long local_140;
  undefined4 local_134;
  long local_130;
  long local_128;
  undefined4 local_11c;
  int local_118;
  int local_114;
  undefined8 *local_110;
  undefined4 local_104;
  long local_100;
  undefined4 local_f4;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  undefined4 local_c4;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  void *local_a8;
  void *local_a0;
  void *local_98;
  
  _c = (int)((ulong)in_stack_fffffffffffff440 >> 0x20);
  local_6ec = 1;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 2) {
    local_6ec = 2;
  }
  uVar3 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / (long)local_6ec;
  uVar3 = (long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
          (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
  local_6f0 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 4);
  _elempack = (int)((ulong)in_stack_fffffffffffff430 >> 0x20);
  local_6e8 = in_RSI;
  Mat::create(in_stack_fffffffffffff450,(int)((ulong)in_stack_fffffffffffff448 >> 0x20),
              (int)in_stack_fffffffffffff448,_c,in_stack_fffffffffffff438,_elempack,
              in_stack_fffffffffffff4b0);
  Mat::create(in_stack_fffffffffffff450,(int)((ulong)in_stack_fffffffffffff448 >> 0x20),
              (int)in_stack_fffffffffffff448,_c,in_stack_fffffffffffff438,_elempack,
              in_stack_fffffffffffff4b0);
  Mat::create(in_stack_fffffffffffff450,(int)((ulong)in_stack_fffffffffffff448 >> 0x20),
              (int)in_stack_fffffffffffff448,_c,in_stack_fffffffffffff438,_elempack,
              in_stack_fffffffffffff4b0);
  for (local_6f4 = 0; local_6f4 < local_6ec; local_6f4 = local_6f4 + 1) {
    lVar4 = *(long *)(*in_RDI + -0x18);
    local_5d0 = (long *)((long)in_RDI + lVar4 + 0x128);
    local_5c8 = &local_740;
    local_22c = *(int *)((long)in_RDI + lVar4 + 0x154);
    local_230 = *(int *)((long)in_RDI + lVar4 + 0x158);
    local_234 = *(undefined4 *)((long)in_RDI + lVar4 + 0x15c);
    local_240 = *local_5d0 +
                *(long *)((long)in_RDI + lVar4 + 0x168) * (long)local_6f4 *
                *(long *)((long)in_RDI + lVar4 + 0x138);
    local_248 = *(long *)((long)in_RDI + lVar4 + 0x138);
    local_24c = *(undefined4 *)((long)in_RDI + lVar4 + 0x140);
    local_258 = *(undefined8 *)((long)in_RDI + lVar4 + 0x148);
    local_228 = &local_740;
    local_b0 = (long)local_22c * (long)local_230 * local_248;
    lVar4 = *(long *)(*in_RDI + -0x18);
    local_5f0 = (long *)((long)in_RDI + lVar4 + 0x170);
    local_5e8 = &local_788;
    local_1f4 = *(int *)((long)in_RDI + lVar4 + 0x19c);
    local_1f8 = *(int *)((long)in_RDI + lVar4 + 0x1a0);
    local_1fc = *(undefined4 *)((long)in_RDI + lVar4 + 0x1a4);
    local_208 = *local_5f0 +
                *(long *)((long)in_RDI + lVar4 + 0x1b0) * (long)local_6f4 *
                *(long *)((long)in_RDI + lVar4 + 0x180);
    local_210 = *(long *)((long)in_RDI + lVar4 + 0x180);
    local_214 = *(undefined4 *)((long)in_RDI + lVar4 + 0x188);
    local_220 = *(undefined8 *)((long)in_RDI + lVar4 + 400);
    local_1f0 = &local_788;
    local_c0 = (long)local_1f4 * (long)local_1f8 * local_210;
    lVar4 = *(long *)(*in_RDI + -0x18);
    local_610 = (long *)((long)in_RDI + lVar4 + 0xe0);
    local_608 = &local_7e0;
    local_1bc = *(int *)((long)in_RDI + lVar4 + 0x10c);
    local_1c0 = *(int *)((long)in_RDI + lVar4 + 0x110);
    local_1c4 = *(undefined4 *)((long)in_RDI + lVar4 + 0x114);
    local_1d0 = *local_610 +
                *(long *)((long)in_RDI + lVar4 + 0x120) * (long)local_6f4 *
                *(long *)((long)in_RDI + lVar4 + 0xf0);
    local_1d8 = *(long *)((long)in_RDI + lVar4 + 0xf0);
    local_1dc = *(undefined4 *)((long)in_RDI + lVar4 + 0xf8);
    local_1e8 = *(undefined8 *)((long)in_RDI + lVar4 + 0x100);
    local_1b8 = &local_7e0;
    local_d0 = (long)local_1bc * (long)local_1c0 * local_1d8;
    local_630 = in_RDI + 1;
    local_628 = &local_828;
    local_184 = *(int *)((long)in_RDI + 0x34);
    local_188 = (int)in_RDI[7];
    local_18c = *(undefined4 *)((long)in_RDI + 0x3c);
    local_198 = *local_630 + in_RDI[9] * (long)local_6f4 * in_RDI[3];
    local_1a0 = in_RDI[3];
    local_1a4 = (undefined4)in_RDI[4];
    local_1b0 = in_RDI[5];
    local_180 = &local_828;
    local_e0 = (long)local_184 * (long)local_188 * local_1a0;
    local_650 = in_RDI + 10;
    local_648 = &local_870;
    local_14c = *(int *)((long)in_RDI + 0x7c);
    local_150 = (int)in_RDI[0x10];
    local_154 = *(undefined4 *)((long)in_RDI + 0x84);
    local_160 = (undefined4 *)(*local_650 + in_RDI[0x12] * (long)local_6f4 * in_RDI[0xc]);
    local_168 = in_RDI[0xc];
    local_16c = (undefined4)in_RDI[0xd];
    local_178 = in_RDI[0xe];
    local_148 = &local_870;
    local_f0 = (long)local_14c * (long)local_150 * local_168;
    local_670 = in_RDI + 0x13;
    local_668 = &local_8b8;
    local_114 = *(int *)((long)in_RDI + 0xc4);
    local_118 = (int)in_RDI[0x19];
    local_11c = *(undefined4 *)((long)in_RDI + 0xcc);
    local_128 = *local_670 + in_RDI[0x1b] * (long)local_6f4 * in_RDI[0x15];
    local_130 = in_RDI[0x15];
    local_134 = (undefined4)in_RDI[0x16];
    local_140 = in_RDI[0x17];
    local_110 = &local_8b8;
    local_100 = (long)local_114 * (long)local_118 * local_130;
    local_400 = &local_788;
    local_410 = &local_788;
    lVar4 = local_208 + local_1f4 * local_210;
    local_420 = &local_788;
    lVar5 = local_208 + (long)local_1f4 * 2 * local_210;
    local_430 = &local_788;
    lVar6 = local_208 + (long)local_1f4 * 3 * local_210;
    local_3b0 = &local_870;
    local_8e0 = local_160;
    for (local_8e4 = 0; local_8e4 + 1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
        local_8e4 = local_8e4 + 2) {
      *local_8e0 = *(undefined4 *)(local_208 + (long)local_8e4 * 4);
      local_8e0[1] = *(undefined4 *)(lVar4 + (long)local_8e4 * 4);
      local_8e0[2] = *(undefined4 *)(lVar5 + (long)local_8e4 * 4);
      local_8e0[3] = *(undefined4 *)(lVar6 + (long)local_8e4 * 4);
      local_8e0[4] = *(undefined4 *)(local_208 + (long)(local_8e4 + 1) * 4);
      local_8e0[5] = *(undefined4 *)(lVar4 + (long)(local_8e4 + 1) * 4);
      local_8e0[6] = *(undefined4 *)(lVar5 + (long)(local_8e4 + 1) * 4);
      local_8e0[7] = *(undefined4 *)(lVar6 + (long)(local_8e4 + 1) * 4);
      local_8e0 = local_8e0 + 8;
      local_440 = &local_740;
      local_444 = local_8e4;
      local_454 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + local_8e4;
      local_450 = &local_740;
      local_464 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 2 + local_8e4;
      local_460 = &local_740;
      local_474 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 3 + local_8e4;
      local_470 = &local_740;
      local_484 = local_8e4 + 1;
      local_480 = &local_740;
      local_494 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + local_8e4 + 1;
      local_490 = &local_740;
      local_4a4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 2 + local_8e4 + 1;
      local_4a0 = &local_740;
      local_4b4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 3 + local_8e4 + 1;
      local_4b0 = &local_740;
      local_4c0 = &local_7e0;
      local_4c4 = local_8e4;
      local_4d4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + local_8e4;
      local_4d0 = &local_7e0;
      local_4e4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 2 + local_8e4;
      local_4e0 = &local_7e0;
      local_4f4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 3 + local_8e4;
      local_4f0 = &local_7e0;
      local_504 = local_8e4 + 1;
      local_500 = &local_7e0;
      local_514 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + local_8e4 + 1;
      local_510 = &local_7e0;
      local_524 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 2 + local_8e4 + 1;
      local_520 = &local_7e0;
      local_534 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 3 + local_8e4 + 1;
      local_530 = &local_7e0;
      local_3c4 = local_8e4 / 2;
      local_3c0 = &local_828;
      local_970 = (undefined4 *)(local_198 + (long)local_184 * (long)local_3c4 * local_1a0);
      local_3d4 = local_8e4 / 2;
      local_3d0 = &local_8b8;
      local_978 = (undefined4 *)(local_128 + (long)local_114 * (long)local_3d4 * local_130);
      for (local_97c = 0; local_97c < local_6f0; local_97c = local_97c + 1) {
        *local_970 = *(undefined4 *)
                      (local_240 + (long)local_22c * (long)local_8e4 * local_248 +
                      (long)local_97c * 4);
        local_970[1] = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_454 * local_248 +
                        (long)local_97c * 4);
        local_970[2] = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_464 * local_248 +
                        (long)local_97c * 4);
        local_970[3] = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_474 * local_248 +
                        (long)local_97c * 4);
        local_970[4] = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_484 * local_248 +
                        (long)local_97c * 4);
        local_970[5] = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_494 * local_248 +
                        (long)local_97c * 4);
        local_970[6] = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_4a4 * local_248 +
                        (long)local_97c * 4);
        local_970[7] = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_4b4 * local_248 +
                        (long)local_97c * 4);
        local_970 = local_970 + 8;
      }
      for (local_980 = 0; local_980 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
          local_980 = local_980 + 1) {
        *local_978 = *(undefined4 *)
                      (local_1d0 + (long)local_1bc * (long)local_8e4 * local_1d8 +
                      (long)local_980 * 4);
        local_978[1] = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_4d4 * local_1d8 +
                        (long)local_980 * 4);
        local_978[2] = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_4e4 * local_1d8 +
                        (long)local_980 * 4);
        local_978[3] = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_4f4 * local_1d8 +
                        (long)local_980 * 4);
        local_978[4] = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_504 * local_1d8 +
                        (long)local_980 * 4);
        local_978[5] = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_514 * local_1d8 +
                        (long)local_980 * 4);
        local_978[6] = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_524 * local_1d8 +
                        (long)local_980 * 4);
        local_978[7] = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_534 * local_1d8 +
                        (long)local_980 * 4);
        local_978 = local_978 + 8;
      }
    }
    for (; local_8e4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
        local_8e4 = local_8e4 + 1) {
      *local_8e0 = *(undefined4 *)(local_208 + (long)local_8e4 * 4);
      local_8e0[1] = *(undefined4 *)(lVar4 + (long)local_8e4 * 4);
      local_8e0[2] = *(undefined4 *)(lVar5 + (long)local_8e4 * 4);
      local_8e0[3] = *(undefined4 *)(lVar6 + (long)local_8e4 * 4);
      local_8e0 = local_8e0 + 4;
      local_540 = &local_740;
      local_544 = local_8e4;
      local_554 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + local_8e4;
      local_550 = &local_740;
      local_564 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 2 + local_8e4;
      local_560 = &local_740;
      local_574 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 3 + local_8e4;
      local_570 = &local_740;
      local_580 = &local_7e0;
      local_584 = local_8e4;
      local_594 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + local_8e4;
      local_590 = &local_7e0;
      local_5a4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 2 + local_8e4;
      local_5a0 = &local_7e0;
      local_5b4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 3 + local_8e4;
      local_5b0 = &local_7e0;
      local_3e4 = local_8e4 / 2 + local_8e4 % 2;
      local_3e0 = &local_828;
      local_9c8 = (undefined4 *)(local_198 + (long)local_184 * (long)local_3e4 * local_1a0);
      local_3f4 = local_8e4 / 2 + local_8e4 % 2;
      local_3f0 = &local_8b8;
      local_9d0 = (undefined4 *)(local_128 + (long)local_114 * (long)local_3f4 * local_130);
      for (local_9d4 = 0; local_9d4 < local_6f0; local_9d4 = local_9d4 + 1) {
        *local_9c8 = *(undefined4 *)
                      (local_240 + (long)local_22c * (long)local_8e4 * local_248 +
                      (long)local_9d4 * 4);
        local_9c8[1] = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_554 * local_248 +
                        (long)local_9d4 * 4);
        local_9c8[2] = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_564 * local_248 +
                        (long)local_9d4 * 4);
        local_9c8[3] = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_574 * local_248 +
                        (long)local_9d4 * 4);
        local_9c8 = local_9c8 + 4;
      }
      for (local_9d8 = 0; local_9d8 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
          local_9d8 = local_9d8 + 1) {
        *local_9d0 = *(undefined4 *)
                      (local_1d0 + (long)local_1bc * (long)local_8e4 * local_1d8 +
                      (long)local_9d8 * 4);
        local_9d0[1] = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_594 * local_1d8 +
                        (long)local_9d8 * 4);
        local_9d0[2] = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_5a4 * local_1d8 +
                        (long)local_9d8 * 4);
        local_9d0[3] = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_5b4 * local_1d8 +
                        (long)local_9d8 * 4);
        local_9d0 = local_9d0 + 4;
      }
    }
    local_6d8 = &local_8b8;
    local_6c8 = &local_870;
    local_6b8 = &local_828;
    local_6a8 = &local_7e0;
    local_698 = &local_788;
    local_7a8 = 0;
    local_7ac = 0;
    local_7b0 = 0;
    local_7b4 = 0;
    local_7c8 = 0;
    local_7d0 = 0;
    local_7d8 = 0;
    local_7e0 = 0;
    local_7f0 = 0;
    local_7f4 = 0;
    local_7f8 = 0;
    local_7fc = 0;
    local_810 = 0;
    local_818 = 0;
    local_820 = 0;
    local_828 = 0;
    local_838 = 0;
    local_83c = 0;
    local_840 = 0;
    local_844 = 0;
    local_858 = 0;
    local_860 = 0;
    local_868 = 0;
    local_870 = 0;
    local_880 = 0;
    local_884 = 0;
    local_888 = 0;
    local_88c = 0;
    local_8a0 = 0;
    local_8a8 = 0;
    local_8b0 = 0;
    local_8b8 = 0;
    local_7a0 = 0;
    local_7b8 = 0;
    local_7e8 = 0;
    local_800 = 0;
    local_830 = 0;
    local_848 = 0;
    local_878 = 0;
    local_890 = 0;
    local_788 = 0;
    local_778 = 0;
    local_770 = 0;
    local_760 = 0;
    local_75c = 0;
    local_758 = 0;
    local_754 = 0;
    local_750 = 0;
    local_748 = 0;
    local_780 = 0;
    local_688 = &local_740;
    local_b4 = 0x10;
    local_c4 = 0x10;
    local_d4 = 0x10;
    local_e4 = 0x10;
    local_f4 = 0x10;
    local_104 = 0x10;
    local_3b4 = 0;
    local_404 = 0;
    local_414 = 1;
    local_424 = 2;
    local_434 = 3;
    local_5d4 = local_6f4;
    local_5d5 = 1;
    local_5f4 = local_6f4;
    local_5f5 = 1;
    local_614 = local_6f4;
    local_615 = 1;
    local_634 = local_6f4;
    local_635 = 1;
    local_654 = local_6f4;
    local_655 = 1;
    local_674 = local_6f4;
    local_675 = 1;
    local_740 = 0;
    local_730 = 0;
    local_728 = 0;
    local_718 = 0;
    local_714 = 0;
    local_710 = 0;
    local_70c = 0;
    local_708 = 0;
    local_700 = 0;
    local_738 = 0;
    local_330 = local_688;
    local_310 = local_698;
    local_2f0 = local_6a8;
    local_2d0 = local_6b8;
    local_2b0 = local_6c8;
    local_290 = local_6d8;
    local_898 = local_140;
    local_850 = local_178;
    local_808 = local_1b0;
    local_7c0 = local_1e8;
    local_768 = local_220;
    local_720 = local_258;
  }
  if ((*local_6e8 & 1) != 0) {
    lVar4 = *(long *)(*in_RDI + -0x18);
    puVar7 = (undefined8 *)((long)in_RDI + lVar4 + 0x128);
    local_260 = puVar7;
    if (*(long *)((long)in_RDI + lVar4 + 0x130) != 0) {
      piVar1 = *(int **)((long)in_RDI + lVar4 + 0x130);
      local_264 = 0xffffffff;
      LOCK();
      local_268 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_268 == 1) {
        if (*(long *)((long)in_RDI + lVar4 + 0x148) == 0) {
          local_a8 = (void *)*puVar7;
          if (local_a8 != (void *)0x0) {
            free(local_a8);
          }
        }
        else {
          plVar2 = *(long **)((long)in_RDI + lVar4 + 0x148);
          (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
        }
      }
    }
    *puVar7 = 0;
    *(undefined8 *)((long)in_RDI + lVar4 + 0x138) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x140) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x150) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x154) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x158) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x15c) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x160) = 0;
    *(undefined8 *)((long)in_RDI + lVar4 + 0x168) = 0;
    *(undefined8 *)((long)in_RDI + lVar4 + 0x130) = 0;
    lVar4 = *(long *)(*in_RDI + -0x18);
    puVar7 = (undefined8 *)((long)in_RDI + lVar4 + 0x170);
    local_270 = puVar7;
    if (*(long *)((long)in_RDI + lVar4 + 0x178) != 0) {
      piVar1 = *(int **)((long)in_RDI + lVar4 + 0x178);
      local_274 = 0xffffffff;
      LOCK();
      local_278 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_278 == 1) {
        if (*(long *)((long)in_RDI + lVar4 + 400) == 0) {
          local_a0 = (void *)*puVar7;
          if (local_a0 != (void *)0x0) {
            free(local_a0);
          }
        }
        else {
          plVar2 = *(long **)((long)in_RDI + lVar4 + 400);
          (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
        }
      }
    }
    *puVar7 = 0;
    *(undefined8 *)((long)in_RDI + lVar4 + 0x180) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x188) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x198) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x19c) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x1a0) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x1a4) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x1a8) = 0;
    *(undefined8 *)((long)in_RDI + lVar4 + 0x1b0) = 0;
    *(undefined8 *)((long)in_RDI + lVar4 + 0x178) = 0;
    lVar4 = *(long *)(*in_RDI + -0x18);
    puVar7 = (undefined8 *)((long)in_RDI + lVar4 + 0xe0);
    if (*(long *)((long)in_RDI + lVar4 + 0xe8) != 0) {
      piVar1 = *(int **)((long)in_RDI + lVar4 + 0xe8);
      local_284 = 0xffffffff;
      LOCK();
      local_288 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_288 == 1) {
        local_280 = puVar7;
        if (*(long *)((long)in_RDI + lVar4 + 0x100) == 0) {
          local_98 = (void *)*puVar7;
          if (local_98 != (void *)0x0) {
            free(local_98);
          }
        }
        else {
          plVar2 = *(long **)((long)in_RDI + lVar4 + 0x100);
          (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
        }
      }
    }
    *puVar7 = 0;
    *(undefined8 *)((long)in_RDI + lVar4 + 0xf0) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0xf8) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x108) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x10c) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x110) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x114) = 0;
    *(undefined4 *)((long)in_RDI + lVar4 + 0x118) = 0;
    *(undefined8 *)((long)in_RDI + lVar4 + 0x120) = 0;
    *(undefined8 *)((long)in_RDI + lVar4 + 0xe8) = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86_avx::create_pipeline(const Option& opt)
{
    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}